

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O1

uintwide_t<512U,_unsigned_int,_void,_false> * __thiscall
math::wide_integer::gcd<512u,unsigned_int,void,false>
          (uintwide_t<512U,_unsigned_int,_void,_false> *__return_storage_ptr__,wide_integer *this,
          uintwide_t<512U,_unsigned_int,_void,_false> *a,
          uintwide_t<512U,_unsigned_int,_void,_false> *b)

{
  value_type_conflict *pvVar1;
  uint *puVar2;
  uint uVar3;
  unsigned_long uVar4;
  unsigned_long uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  enable_if_t<std::is_integral<unsigned_long>::value,_bool> eVar22;
  unsigned_long vr;
  unsigned_fast_type uVar23;
  unsigned_fast_type n;
  uint uVar24;
  long lVar25;
  undefined1 *puVar26;
  ulong uVar27;
  long lVar28;
  value_type_conflict *pvVar29;
  byte bVar30;
  bool bVar31;
  local_wide_integer_type u;
  local_wide_integer_type v;
  uintwide_t<512U,_unsigned_int,_void,_false> local_148;
  uintwide_t<512U,_unsigned_int,_void,_false> local_108;
  uintwide_t<512U,_unsigned_int,_void,_false> local_c8;
  undefined1 local_88 [8];
  unsigned_fast_type local_80;
  
  uVar4 = *(unsigned_long *)this;
  local_108.values.super_array<unsigned_int,_16UL>.elems._48_8_ = *(undefined8 *)(this + 0x30);
  local_108.values.super_array<unsigned_int,_16UL>.elems._56_8_ = *(undefined8 *)(this + 0x38);
  local_108.values.super_array<unsigned_int,_16UL>.elems._32_8_ = *(undefined8 *)(this + 0x20);
  local_108.values.super_array<unsigned_int,_16UL>.elems._40_8_ = *(undefined8 *)(this + 0x28);
  local_108.values.super_array<unsigned_int,_16UL>.elems._16_8_ = *(undefined8 *)(this + 0x10);
  local_108.values.super_array<unsigned_int,_16UL>.elems._24_8_ = *(undefined8 *)(this + 0x18);
  local_108.values.super_array<unsigned_int,_16UL>.elems[0] = (int)uVar4;
  local_108.values.super_array<unsigned_int,_16UL>.elems[1] = (int)(uVar4 >> 0x20);
  uVar6 = local_108.values.super_array<unsigned_int,_16UL>.elems._0_8_;
  local_108.values.super_array<unsigned_int,_16UL>.elems._8_8_ = *(undefined8 *)(this + 8);
  uVar5 = *(unsigned_long *)(a->values).super_array<unsigned_int,_16UL>.elems;
  local_c8.values.super_array<unsigned_int,_16UL>.elems._48_8_ =
       *(undefined8 *)((a->values).super_array<unsigned_int,_16UL>.elems + 0xc);
  local_c8.values.super_array<unsigned_int,_16UL>.elems._56_8_ =
       *(undefined8 *)((a->values).super_array<unsigned_int,_16UL>.elems + 0xe);
  local_c8.values.super_array<unsigned_int,_16UL>.elems._32_8_ =
       *(undefined8 *)((a->values).super_array<unsigned_int,_16UL>.elems + 8);
  local_c8.values.super_array<unsigned_int,_16UL>.elems._40_8_ =
       *(undefined8 *)((a->values).super_array<unsigned_int,_16UL>.elems + 10);
  local_c8.values.super_array<unsigned_int,_16UL>.elems._16_8_ =
       *(undefined8 *)((a->values).super_array<unsigned_int,_16UL>.elems + 4);
  local_c8.values.super_array<unsigned_int,_16UL>.elems._24_8_ =
       *(undefined8 *)((a->values).super_array<unsigned_int,_16UL>.elems + 6);
  local_c8.values.super_array<unsigned_int,_16UL>.elems[0] = (int)uVar5;
  local_c8.values.super_array<unsigned_int,_16UL>.elems[1] = (int)(uVar5 >> 0x20);
  uVar8 = local_c8.values.super_array<unsigned_int,_16UL>.elems._0_8_;
  local_c8.values.super_array<unsigned_int,_16UL>.elems._8_8_ =
       *(undefined8 *)((a->values).super_array<unsigned_int,_16UL>.elems + 2);
  (__return_storage_ptr__->values).super_array<unsigned_int,_16UL>.elems[0xc] = 0;
  (__return_storage_ptr__->values).super_array<unsigned_int,_16UL>.elems[0xd] = 0;
  (__return_storage_ptr__->values).super_array<unsigned_int,_16UL>.elems[0xe] = 0;
  (__return_storage_ptr__->values).super_array<unsigned_int,_16UL>.elems[0xf] = 0;
  (__return_storage_ptr__->values).super_array<unsigned_int,_16UL>.elems[8] = 0;
  (__return_storage_ptr__->values).super_array<unsigned_int,_16UL>.elems[9] = 0;
  (__return_storage_ptr__->values).super_array<unsigned_int,_16UL>.elems[10] = 0;
  (__return_storage_ptr__->values).super_array<unsigned_int,_16UL>.elems[0xb] = 0;
  (__return_storage_ptr__->values).super_array<unsigned_int,_16UL>.elems[4] = 0;
  (__return_storage_ptr__->values).super_array<unsigned_int,_16UL>.elems[5] = 0;
  (__return_storage_ptr__->values).super_array<unsigned_int,_16UL>.elems[6] = 0;
  (__return_storage_ptr__->values).super_array<unsigned_int,_16UL>.elems[7] = 0;
  (__return_storage_ptr__->values).super_array<unsigned_int,_16UL>.elems[0] = 0;
  (__return_storage_ptr__->values).super_array<unsigned_int,_16UL>.elems[1] = 0;
  (__return_storage_ptr__->values).super_array<unsigned_int,_16UL>.elems[2] = 0;
  (__return_storage_ptr__->values).super_array<unsigned_int,_16UL>.elems[3] = 0;
  lVar25 = 0x3c;
  do {
    bVar30 = 0;
    if (lVar25 == -4) break;
    uVar24 = *(uint *)((long)local_108.values.super_array<unsigned_int,_16UL>.elems + lVar25);
    uVar3 = *(uint *)((long)local_c8.values.super_array<unsigned_int,_16UL>.elems + lVar25);
    bVar30 = -(uVar24 <= uVar3) | 1;
    lVar25 = lVar25 + -4;
  } while (uVar24 == uVar3);
  if (bVar30 == 0) {
LAB_001b1236:
    local_148.values.super_array<unsigned_int,_16UL>.elems[0] = *(value_type_conflict *)this;
    local_148.values.super_array<unsigned_int,_16UL>.elems[1] = *(value_type_conflict *)(this + 4);
    local_148.values.super_array<unsigned_int,_16UL>.elems[2] = *(value_type_conflict *)(this + 8);
    local_148.values.super_array<unsigned_int,_16UL>.elems[3] = *(value_type_conflict *)(this + 0xc)
    ;
    local_148.values.super_array<unsigned_int,_16UL>.elems[4] =
         *(value_type_conflict *)(this + 0x10);
    local_148.values.super_array<unsigned_int,_16UL>.elems[5] =
         *(value_type_conflict *)(this + 0x14);
    local_148.values.super_array<unsigned_int,_16UL>.elems[6] =
         *(value_type_conflict *)(this + 0x18);
    local_148.values.super_array<unsigned_int,_16UL>.elems[7] =
         *(value_type_conflict *)(this + 0x1c);
    local_148.values.super_array<unsigned_int,_16UL>.elems[8] =
         *(value_type_conflict *)(this + 0x20);
    local_148.values.super_array<unsigned_int,_16UL>.elems[9] =
         *(value_type_conflict *)(this + 0x24);
    local_148.values.super_array<unsigned_int,_16UL>.elems[10] =
         *(value_type_conflict *)(this + 0x28);
    local_148.values.super_array<unsigned_int,_16UL>.elems[0xb] =
         *(value_type_conflict *)(this + 0x2c);
    local_148.values.super_array<unsigned_int,_16UL>.elems[0xc] =
         *(value_type_conflict *)(this + 0x30);
    local_148.values.super_array<unsigned_int,_16UL>.elems[0xd] =
         *(value_type_conflict *)(this + 0x34);
    local_148.values.super_array<unsigned_int,_16UL>.elems[0xe] =
         *(value_type_conflict *)(this + 0x38);
    local_148.values.super_array<unsigned_int,_16UL>.elems[0xf] =
         *(value_type_conflict *)(this + 0x3c);
LAB_001b152c:
    (__return_storage_ptr__->values).super_array<unsigned_int,_16UL>.elems[0xc] =
         local_148.values.super_array<unsigned_int,_16UL>.elems[0xc];
    (__return_storage_ptr__->values).super_array<unsigned_int,_16UL>.elems[0xd] =
         local_148.values.super_array<unsigned_int,_16UL>.elems[0xd];
    (__return_storage_ptr__->values).super_array<unsigned_int,_16UL>.elems[0xe] =
         local_148.values.super_array<unsigned_int,_16UL>.elems[0xe];
    (__return_storage_ptr__->values).super_array<unsigned_int,_16UL>.elems[0xf] =
         local_148.values.super_array<unsigned_int,_16UL>.elems[0xf];
    (__return_storage_ptr__->values).super_array<unsigned_int,_16UL>.elems[8] =
         local_148.values.super_array<unsigned_int,_16UL>.elems[8];
    (__return_storage_ptr__->values).super_array<unsigned_int,_16UL>.elems[9] =
         local_148.values.super_array<unsigned_int,_16UL>.elems[9];
    (__return_storage_ptr__->values).super_array<unsigned_int,_16UL>.elems[10] =
         local_148.values.super_array<unsigned_int,_16UL>.elems[10];
    (__return_storage_ptr__->values).super_array<unsigned_int,_16UL>.elems[0xb] =
         local_148.values.super_array<unsigned_int,_16UL>.elems[0xb];
    (__return_storage_ptr__->values).super_array<unsigned_int,_16UL>.elems[4] =
         local_148.values.super_array<unsigned_int,_16UL>.elems[4];
    (__return_storage_ptr__->values).super_array<unsigned_int,_16UL>.elems[5] =
         local_148.values.super_array<unsigned_int,_16UL>.elems[5];
    (__return_storage_ptr__->values).super_array<unsigned_int,_16UL>.elems[6] =
         local_148.values.super_array<unsigned_int,_16UL>.elems[6];
    (__return_storage_ptr__->values).super_array<unsigned_int,_16UL>.elems[7] =
         local_148.values.super_array<unsigned_int,_16UL>.elems[7];
    (__return_storage_ptr__->values).super_array<unsigned_int,_16UL>.elems[0] =
         local_148.values.super_array<unsigned_int,_16UL>.elems[0];
    (__return_storage_ptr__->values).super_array<unsigned_int,_16UL>.elems[1] =
         local_148.values.super_array<unsigned_int,_16UL>.elems[1];
    (__return_storage_ptr__->values).super_array<unsigned_int,_16UL>.elems[2] =
         local_148.values.super_array<unsigned_int,_16UL>.elems[2];
    (__return_storage_ptr__->values).super_array<unsigned_int,_16UL>.elems[3] =
         local_148.values.super_array<unsigned_int,_16UL>.elems[3];
    return __return_storage_ptr__;
  }
  local_c8.values.super_array<unsigned_int,_16UL>.elems[0] = (value_type_conflict)uVar5;
  if (local_c8.values.super_array<unsigned_int,_16UL>.elems[0] == 0) {
    local_148.values.super_array<unsigned_int,_16UL>.elems[0xc] = 0;
    local_148.values.super_array<unsigned_int,_16UL>.elems[0xd] = 0;
    local_148.values.super_array<unsigned_int,_16UL>.elems[0xe] = 0;
    local_148.values.super_array<unsigned_int,_16UL>.elems[0xf] = 0;
    local_148.values.super_array<unsigned_int,_16UL>.elems[8] = 0;
    local_148.values.super_array<unsigned_int,_16UL>.elems[9] = 0;
    local_148.values.super_array<unsigned_int,_16UL>.elems[10] = 0;
    local_148.values.super_array<unsigned_int,_16UL>.elems[0xb] = 0;
    local_148.values.super_array<unsigned_int,_16UL>.elems[4] = 0;
    local_148.values.super_array<unsigned_int,_16UL>.elems[5] = 0;
    local_148.values.super_array<unsigned_int,_16UL>.elems[6] = 0;
    local_148.values.super_array<unsigned_int,_16UL>.elems[7] = 0;
    local_148.values.super_array<unsigned_int,_16UL>.elems[0] = 0;
    local_148.values.super_array<unsigned_int,_16UL>.elems[1] = 0;
    local_148.values.super_array<unsigned_int,_16UL>.elems[2] = 0;
    local_148.values.super_array<unsigned_int,_16UL>.elems[3] = 0;
    lVar25 = 0x3c;
    do {
      bVar30 = 0;
      if (lVar25 == -4) break;
      uVar24 = *(uint *)((long)local_c8.values.super_array<unsigned_int,_16UL>.elems + lVar25);
      uVar3 = *(uint *)((long)local_148.values.super_array<unsigned_int,_16UL>.elems + lVar25);
      bVar30 = -(uVar24 <= uVar3) | 1;
      lVar25 = lVar25 + -4;
    } while (uVar24 == uVar3);
    if (bVar30 == 0) goto LAB_001b1236;
  }
  local_108.values.super_array<unsigned_int,_16UL>.elems[0] = (value_type_conflict)uVar4;
  if (local_108.values.super_array<unsigned_int,_16UL>.elems[0] == 0) {
    local_148.values.super_array<unsigned_int,_16UL>.elems[0xc] = 0;
    local_148.values.super_array<unsigned_int,_16UL>.elems[0xd] = 0;
    local_148.values.super_array<unsigned_int,_16UL>.elems[0xe] = 0;
    local_148.values.super_array<unsigned_int,_16UL>.elems[0xf] = 0;
    local_148.values.super_array<unsigned_int,_16UL>.elems[8] = 0;
    local_148.values.super_array<unsigned_int,_16UL>.elems[9] = 0;
    local_148.values.super_array<unsigned_int,_16UL>.elems[10] = 0;
    local_148.values.super_array<unsigned_int,_16UL>.elems[0xb] = 0;
    local_148.values.super_array<unsigned_int,_16UL>.elems[4] = 0;
    local_148.values.super_array<unsigned_int,_16UL>.elems[5] = 0;
    local_148.values.super_array<unsigned_int,_16UL>.elems[6] = 0;
    local_148.values.super_array<unsigned_int,_16UL>.elems[7] = 0;
    local_148.values.super_array<unsigned_int,_16UL>.elems[0] = 0;
    local_148.values.super_array<unsigned_int,_16UL>.elems[1] = 0;
    local_148.values.super_array<unsigned_int,_16UL>.elems[2] = 0;
    local_148.values.super_array<unsigned_int,_16UL>.elems[3] = 0;
    lVar25 = 0x3c;
    do {
      bVar30 = 0;
      if (lVar25 == -4) break;
      uVar24 = *(uint *)((long)local_108.values.super_array<unsigned_int,_16UL>.elems + lVar25);
      uVar3 = *(uint *)((long)local_148.values.super_array<unsigned_int,_16UL>.elems + lVar25);
      bVar30 = -(uVar24 <= uVar3) | 1;
      lVar25 = lVar25 + -4;
    } while (uVar24 == uVar3);
    if (bVar30 == 0) {
      local_148.values.super_array<unsigned_int,_16UL>.elems[0] =
           (a->values).super_array<unsigned_int,_16UL>.elems[0];
      local_148.values.super_array<unsigned_int,_16UL>.elems[1] =
           (a->values).super_array<unsigned_int,_16UL>.elems[1];
      local_148.values.super_array<unsigned_int,_16UL>.elems[2] =
           (a->values).super_array<unsigned_int,_16UL>.elems[2];
      local_148.values.super_array<unsigned_int,_16UL>.elems[3] =
           (a->values).super_array<unsigned_int,_16UL>.elems[3];
      local_148.values.super_array<unsigned_int,_16UL>.elems[4] =
           (a->values).super_array<unsigned_int,_16UL>.elems[4];
      local_148.values.super_array<unsigned_int,_16UL>.elems[5] =
           (a->values).super_array<unsigned_int,_16UL>.elems[5];
      local_148.values.super_array<unsigned_int,_16UL>.elems[6] =
           (a->values).super_array<unsigned_int,_16UL>.elems[6];
      local_148.values.super_array<unsigned_int,_16UL>.elems[7] =
           (a->values).super_array<unsigned_int,_16UL>.elems[7];
      local_148.values.super_array<unsigned_int,_16UL>.elems[8] =
           (a->values).super_array<unsigned_int,_16UL>.elems[8];
      local_148.values.super_array<unsigned_int,_16UL>.elems[9] =
           (a->values).super_array<unsigned_int,_16UL>.elems[9];
      local_148.values.super_array<unsigned_int,_16UL>.elems[10] =
           (a->values).super_array<unsigned_int,_16UL>.elems[10];
      local_148.values.super_array<unsigned_int,_16UL>.elems[0xb] =
           (a->values).super_array<unsigned_int,_16UL>.elems[0xb];
      local_148.values.super_array<unsigned_int,_16UL>.elems[0xc] =
           (a->values).super_array<unsigned_int,_16UL>.elems[0xc];
      local_148.values.super_array<unsigned_int,_16UL>.elems[0xd] =
           (a->values).super_array<unsigned_int,_16UL>.elems[0xd];
      local_148.values.super_array<unsigned_int,_16UL>.elems[0xe] =
           (a->values).super_array<unsigned_int,_16UL>.elems[0xe];
      local_148.values.super_array<unsigned_int,_16UL>.elems[0xf] =
           (a->values).super_array<unsigned_int,_16UL>.elems[0xf];
      goto LAB_001b152c;
    }
  }
  local_108.values.super_array<unsigned_int,_16UL>.elems._0_8_ = uVar6;
  local_c8.values.super_array<unsigned_int,_16UL>.elems._0_8_ = uVar8;
  uVar23 = lsb<512u,unsigned_int,void,false>(&local_108);
  n = lsb<512u,unsigned_int,void,false>(&local_c8);
  local_80 = uVar23;
  if (n < uVar23) {
    local_80 = n;
  }
  if (uVar23 != 0) {
    if ((uVar23 & 0xfffffe00) == 0) {
      uintwide_t<512U,_unsigned_int,_void,_false>::shr<unsigned_long>(&local_108,uVar23);
    }
    else {
      local_108.values.super_array<unsigned_int,_16UL>.elems[0xc] = 0;
      local_108.values.super_array<unsigned_int,_16UL>.elems[0xd] = 0;
      local_108.values.super_array<unsigned_int,_16UL>.elems[0xe] = 0;
      local_108.values.super_array<unsigned_int,_16UL>.elems[0xf] = 0;
      local_108.values.super_array<unsigned_int,_16UL>.elems[8] = 0;
      local_108.values.super_array<unsigned_int,_16UL>.elems[9] = 0;
      local_108.values.super_array<unsigned_int,_16UL>.elems[10] = 0;
      local_108.values.super_array<unsigned_int,_16UL>.elems[0xb] = 0;
      local_108.values.super_array<unsigned_int,_16UL>.elems[4] = 0;
      local_108.values.super_array<unsigned_int,_16UL>.elems[5] = 0;
      local_108.values.super_array<unsigned_int,_16UL>.elems[6] = 0;
      local_108.values.super_array<unsigned_int,_16UL>.elems[7] = 0;
      local_108.values.super_array<unsigned_int,_16UL>.elems[0] = 0;
      local_108.values.super_array<unsigned_int,_16UL>.elems[1] = 0;
      local_108.values.super_array<unsigned_int,_16UL>.elems[2] = 0;
      local_108.values.super_array<unsigned_int,_16UL>.elems[3] = 0;
    }
  }
  if (n != 0) {
    if ((n & 0xfffffe00) == 0) {
      uintwide_t<512U,_unsigned_int,_void,_false>::shr<unsigned_long>(&local_c8,n);
    }
    else {
      local_c8.values.super_array<unsigned_int,_16UL>.elems[0xc] = 0;
      local_c8.values.super_array<unsigned_int,_16UL>.elems[0xd] = 0;
      local_c8.values.super_array<unsigned_int,_16UL>.elems[0xe] = 0;
      local_c8.values.super_array<unsigned_int,_16UL>.elems[0xf] = 0;
      local_c8.values.super_array<unsigned_int,_16UL>.elems[8] = 0;
      local_c8.values.super_array<unsigned_int,_16UL>.elems[9] = 0;
      local_c8.values.super_array<unsigned_int,_16UL>.elems[10] = 0;
      local_c8.values.super_array<unsigned_int,_16UL>.elems[0xb] = 0;
      local_c8.values.super_array<unsigned_int,_16UL>.elems[4] = 0;
      local_c8.values.super_array<unsigned_int,_16UL>.elems[5] = 0;
      local_c8.values.super_array<unsigned_int,_16UL>.elems[6] = 0;
      local_c8.values.super_array<unsigned_int,_16UL>.elems[7] = 0;
      local_c8.values.super_array<unsigned_int,_16UL>.elems[0] = 0;
      local_c8.values.super_array<unsigned_int,_16UL>.elems[1] = 0;
      local_c8.values.super_array<unsigned_int,_16UL>.elems[2] = 0;
      local_c8.values.super_array<unsigned_int,_16UL>.elems[3] = 0;
    }
  }
  puVar26 = local_88;
  pvVar29 = (value_type_conflict *)&local_c8;
LAB_001b12ad:
  uVar20 = local_108.values.super_array<unsigned_int,_16UL>.elems._56_8_;
  uVar18 = local_108.values.super_array<unsigned_int,_16UL>.elems._48_8_;
  uVar16 = local_108.values.super_array<unsigned_int,_16UL>.elems._40_8_;
  uVar14 = local_108.values.super_array<unsigned_int,_16UL>.elems._32_8_;
  uVar12 = local_108.values.super_array<unsigned_int,_16UL>.elems._24_8_;
  uVar10 = local_108.values.super_array<unsigned_int,_16UL>.elems._16_8_;
  uVar8 = local_108.values.super_array<unsigned_int,_16UL>.elems._8_8_;
  uVar6 = local_108.values.super_array<unsigned_int,_16UL>.elems._0_8_;
  bVar30 = 0;
  if ((uintwide_t<512U,_unsigned_int,_void,_false> *)pvVar29 != &local_108) goto code_r0x001b12b2;
  goto LAB_001b12dc;
code_r0x001b12b2:
  pvVar1 = pvVar29 + -1;
  puVar2 = (uint *)(puVar26 + -4);
  bVar30 = -(*pvVar1 <= *puVar2) | 1;
  puVar26 = puVar26 + -4;
  pvVar29 = pvVar29 + -1;
  if (*pvVar1 == *puVar2) goto LAB_001b12ad;
LAB_001b12dc:
  if (bVar30 == 1) {
    local_108.values.super_array<unsigned_int,_16UL>.elems[0] =
         local_c8.values.super_array<unsigned_int,_16UL>.elems[0];
    local_108.values.super_array<unsigned_int,_16UL>.elems[1] =
         local_c8.values.super_array<unsigned_int,_16UL>.elems[1];
    uVar7 = local_108.values.super_array<unsigned_int,_16UL>.elems._0_8_;
    local_108.values.super_array<unsigned_int,_16UL>.elems[2] =
         local_c8.values.super_array<unsigned_int,_16UL>.elems[2];
    local_108.values.super_array<unsigned_int,_16UL>.elems[3] =
         local_c8.values.super_array<unsigned_int,_16UL>.elems[3];
    uVar9 = local_108.values.super_array<unsigned_int,_16UL>.elems._8_8_;
    local_108.values.super_array<unsigned_int,_16UL>.elems[4] =
         local_c8.values.super_array<unsigned_int,_16UL>.elems[4];
    local_108.values.super_array<unsigned_int,_16UL>.elems[5] =
         local_c8.values.super_array<unsigned_int,_16UL>.elems[5];
    uVar11 = local_108.values.super_array<unsigned_int,_16UL>.elems._16_8_;
    local_108.values.super_array<unsigned_int,_16UL>.elems[6] =
         local_c8.values.super_array<unsigned_int,_16UL>.elems[6];
    local_108.values.super_array<unsigned_int,_16UL>.elems[7] =
         local_c8.values.super_array<unsigned_int,_16UL>.elems[7];
    uVar13 = local_108.values.super_array<unsigned_int,_16UL>.elems._24_8_;
    local_108.values.super_array<unsigned_int,_16UL>.elems[8] =
         local_c8.values.super_array<unsigned_int,_16UL>.elems[8];
    local_108.values.super_array<unsigned_int,_16UL>.elems[9] =
         local_c8.values.super_array<unsigned_int,_16UL>.elems[9];
    uVar15 = local_108.values.super_array<unsigned_int,_16UL>.elems._32_8_;
    local_108.values.super_array<unsigned_int,_16UL>.elems[10] =
         local_c8.values.super_array<unsigned_int,_16UL>.elems[10];
    local_108.values.super_array<unsigned_int,_16UL>.elems[0xb] =
         local_c8.values.super_array<unsigned_int,_16UL>.elems[0xb];
    uVar17 = local_108.values.super_array<unsigned_int,_16UL>.elems._40_8_;
    local_108.values.super_array<unsigned_int,_16UL>.elems[0xc] =
         local_c8.values.super_array<unsigned_int,_16UL>.elems[0xc];
    local_108.values.super_array<unsigned_int,_16UL>.elems[0xd] =
         local_c8.values.super_array<unsigned_int,_16UL>.elems[0xd];
    uVar19 = local_108.values.super_array<unsigned_int,_16UL>.elems._48_8_;
    local_108.values.super_array<unsigned_int,_16UL>.elems[0xe] =
         local_c8.values.super_array<unsigned_int,_16UL>.elems[0xe];
    local_108.values.super_array<unsigned_int,_16UL>.elems[0xf] =
         local_c8.values.super_array<unsigned_int,_16UL>.elems[0xf];
    uVar21 = local_108.values.super_array<unsigned_int,_16UL>.elems._56_8_;
    local_108.values.super_array<unsigned_int,_16UL>.elems[0] = (value_type_conflict)uVar6;
    local_108.values.super_array<unsigned_int,_16UL>.elems[1] = SUB84(uVar6,4);
    local_c8.values.super_array<unsigned_int,_16UL>.elems[0] =
         local_108.values.super_array<unsigned_int,_16UL>.elems[0];
    local_c8.values.super_array<unsigned_int,_16UL>.elems[1] =
         local_108.values.super_array<unsigned_int,_16UL>.elems[1];
    local_108.values.super_array<unsigned_int,_16UL>.elems[2] = (value_type_conflict)uVar8;
    local_108.values.super_array<unsigned_int,_16UL>.elems[3] = SUB84(uVar8,4);
    local_c8.values.super_array<unsigned_int,_16UL>.elems[2] =
         local_108.values.super_array<unsigned_int,_16UL>.elems[2];
    local_c8.values.super_array<unsigned_int,_16UL>.elems[3] =
         local_108.values.super_array<unsigned_int,_16UL>.elems[3];
    local_108.values.super_array<unsigned_int,_16UL>.elems[4] = (value_type_conflict)uVar10;
    local_108.values.super_array<unsigned_int,_16UL>.elems[5] = SUB84(uVar10,4);
    local_c8.values.super_array<unsigned_int,_16UL>.elems[4] =
         local_108.values.super_array<unsigned_int,_16UL>.elems[4];
    local_c8.values.super_array<unsigned_int,_16UL>.elems[5] =
         local_108.values.super_array<unsigned_int,_16UL>.elems[5];
    local_108.values.super_array<unsigned_int,_16UL>.elems[6] = (value_type_conflict)uVar12;
    local_108.values.super_array<unsigned_int,_16UL>.elems[7] = SUB84(uVar12,4);
    local_c8.values.super_array<unsigned_int,_16UL>.elems[6] =
         local_108.values.super_array<unsigned_int,_16UL>.elems[6];
    local_c8.values.super_array<unsigned_int,_16UL>.elems[7] =
         local_108.values.super_array<unsigned_int,_16UL>.elems[7];
    local_108.values.super_array<unsigned_int,_16UL>.elems[8] = (value_type_conflict)uVar14;
    local_108.values.super_array<unsigned_int,_16UL>.elems[9] = SUB84(uVar14,4);
    local_c8.values.super_array<unsigned_int,_16UL>.elems[8] =
         local_108.values.super_array<unsigned_int,_16UL>.elems[8];
    local_c8.values.super_array<unsigned_int,_16UL>.elems[9] =
         local_108.values.super_array<unsigned_int,_16UL>.elems[9];
    local_108.values.super_array<unsigned_int,_16UL>.elems[10] = (value_type_conflict)uVar16;
    local_108.values.super_array<unsigned_int,_16UL>.elems[0xb] = SUB84(uVar16,4);
    local_c8.values.super_array<unsigned_int,_16UL>.elems[10] =
         local_108.values.super_array<unsigned_int,_16UL>.elems[10];
    local_c8.values.super_array<unsigned_int,_16UL>.elems[0xb] =
         local_108.values.super_array<unsigned_int,_16UL>.elems[0xb];
    local_108.values.super_array<unsigned_int,_16UL>.elems[0xc] = (value_type_conflict)uVar18;
    local_108.values.super_array<unsigned_int,_16UL>.elems[0xd] = SUB84(uVar18,4);
    local_c8.values.super_array<unsigned_int,_16UL>.elems[0xc] =
         local_108.values.super_array<unsigned_int,_16UL>.elems[0xc];
    local_c8.values.super_array<unsigned_int,_16UL>.elems[0xd] =
         local_108.values.super_array<unsigned_int,_16UL>.elems[0xd];
    local_108.values.super_array<unsigned_int,_16UL>.elems[0xe] = (value_type_conflict)uVar20;
    local_108.values.super_array<unsigned_int,_16UL>.elems[0xf] = SUB84(uVar20,4);
    local_c8.values.super_array<unsigned_int,_16UL>.elems[0xe] =
         local_108.values.super_array<unsigned_int,_16UL>.elems[0xe];
    local_c8.values.super_array<unsigned_int,_16UL>.elems[0xf] =
         local_108.values.super_array<unsigned_int,_16UL>.elems[0xf];
    local_108.values.super_array<unsigned_int,_16UL>.elems._0_8_ = uVar7;
    local_108.values.super_array<unsigned_int,_16UL>.elems._8_8_ = uVar9;
    local_108.values.super_array<unsigned_int,_16UL>.elems._16_8_ = uVar11;
    local_108.values.super_array<unsigned_int,_16UL>.elems._24_8_ = uVar13;
    local_108.values.super_array<unsigned_int,_16UL>.elems._32_8_ = uVar15;
    local_108.values.super_array<unsigned_int,_16UL>.elems._40_8_ = uVar17;
    local_108.values.super_array<unsigned_int,_16UL>.elems._48_8_ = uVar19;
    local_108.values.super_array<unsigned_int,_16UL>.elems._56_8_ = uVar21;
  }
  lVar25 = 0x3c;
  do {
    bVar30 = 0;
    if (lVar25 == -4) break;
    uVar24 = *(uint *)((long)local_108.values.super_array<unsigned_int,_16UL>.elems + lVar25);
    uVar3 = *(uint *)((long)local_c8.values.super_array<unsigned_int,_16UL>.elems + lVar25);
    bVar30 = -(uVar24 <= uVar3) | 1;
    lVar25 = lVar25 + -4;
  } while (uVar24 == uVar3);
  if (bVar30 == 0) goto LAB_001b14bd;
  local_148.values.super_array<unsigned_int,_16UL>.elems[0] = 0xffffffff;
  local_148.values.super_array<unsigned_int,_16UL>.elems[1] = 0xffffffff;
  eVar22 = operator<=(&local_c8,(unsigned_long *)&local_148);
  if (!eVar22) {
    lVar25 = 0;
    uVar24 = 0;
    do {
      uVar27 = ((ulong)local_c8.values.super_array<unsigned_int,_16UL>.elems[lVar25] - (ulong)uVar24
               ) - (ulong)local_108.values.super_array<unsigned_int,_16UL>.elems[lVar25];
      local_c8.values.super_array<unsigned_int,_16UL>.elems[lVar25] = (value_type_conflict)uVar27;
      uVar24 = (uint)(uVar27 >> 0x20 != 0);
      lVar25 = lVar25 + 1;
    } while (lVar25 != 0x10);
    uVar23 = lsb<512u,unsigned_int,void,false>(&local_c8);
    puVar26 = local_88;
    pvVar29 = (value_type_conflict *)&local_c8;
    if (uVar23 != 0) {
      if ((uVar23 & 0xfffffe00) == 0) {
        uintwide_t<512U,_unsigned_int,_void,_false>::shr<unsigned_long>(&local_c8,uVar23);
      }
      else {
        local_c8.values.super_array<unsigned_int,_16UL>.elems[0xc] = 0;
        local_c8.values.super_array<unsigned_int,_16UL>.elems[0xd] = 0;
        local_c8.values.super_array<unsigned_int,_16UL>.elems[0xe] = 0;
        local_c8.values.super_array<unsigned_int,_16UL>.elems[0xf] = 0;
        local_c8.values.super_array<unsigned_int,_16UL>.elems[8] = 0;
        local_c8.values.super_array<unsigned_int,_16UL>.elems[9] = 0;
        local_c8.values.super_array<unsigned_int,_16UL>.elems[10] = 0;
        local_c8.values.super_array<unsigned_int,_16UL>.elems[0xb] = 0;
        local_c8.values.super_array<unsigned_int,_16UL>.elems[4] = 0;
        local_c8.values.super_array<unsigned_int,_16UL>.elems[5] = 0;
        local_c8.values.super_array<unsigned_int,_16UL>.elems[6] = 0;
        local_c8.values.super_array<unsigned_int,_16UL>.elems[7] = 0;
        local_c8.values.super_array<unsigned_int,_16UL>.elems[0] = 0;
        local_c8.values.super_array<unsigned_int,_16UL>.elems[1] = 0;
        local_c8.values.super_array<unsigned_int,_16UL>.elems[2] = 0;
        local_c8.values.super_array<unsigned_int,_16UL>.elems[3] = 0;
      }
    }
    goto LAB_001b12ad;
  }
  uVar27 = std::__detail::__gcd<unsigned_long>
                     (local_c8.values.super_array<unsigned_int,_16UL>.elems._0_8_,
                      local_108.values.super_array<unsigned_int,_16UL>.elems._0_8_);
  local_148.values.super_array<unsigned_int,_16UL>.elems[0] = 0;
  local_148.values.super_array<unsigned_int,_16UL>.elems[1] = 0;
  local_148.values.super_array<unsigned_int,_16UL>.elems[2] = 0;
  local_148.values.super_array<unsigned_int,_16UL>.elems[3] = 0;
  local_148.values.super_array<unsigned_int,_16UL>.elems[4] = 0;
  local_148.values.super_array<unsigned_int,_16UL>.elems[5] = 0;
  local_148.values.super_array<unsigned_int,_16UL>.elems[6] = 0;
  local_148.values.super_array<unsigned_int,_16UL>.elems[7] = 0;
  local_148.values.super_array<unsigned_int,_16UL>.elems[8] = 0;
  local_148.values.super_array<unsigned_int,_16UL>.elems[9] = 0;
  local_148.values.super_array<unsigned_int,_16UL>.elems[10] = 0;
  local_148.values.super_array<unsigned_int,_16UL>.elems[0xb] = 0;
  local_148.values.super_array<unsigned_int,_16UL>.elems[0xc] = 0;
  local_148.values.super_array<unsigned_int,_16UL>.elems[0xd] = 0;
  local_148.values.super_array<unsigned_int,_16UL>.elems[0xe] = 0;
  local_148.values.super_array<unsigned_int,_16UL>.elems[0xf] = 0;
  if (uVar27 == 0) {
    lVar25 = 0;
  }
  else {
    lVar28 = 0;
    do {
      *(int *)((long)local_148.values.super_array<unsigned_int,_16UL>.elems + lVar28) = (int)uVar27;
      lVar25 = lVar28 + 4;
      uVar27 = uVar27 >> 0x20;
      if (uVar27 == 0) break;
      bVar31 = lVar28 != 0x3c;
      lVar28 = lVar25;
    } while (bVar31);
  }
  if (lVar25 != 0x40) {
    memset((void *)((long)local_148.values.super_array<unsigned_int,_16UL>.elems + lVar25),0,
           0x40 - lVar25);
  }
  local_108.values.super_array<unsigned_int,_16UL>.elems[0xc] =
       local_148.values.super_array<unsigned_int,_16UL>.elems[0xc];
  local_108.values.super_array<unsigned_int,_16UL>.elems[0xd] =
       local_148.values.super_array<unsigned_int,_16UL>.elems[0xd];
  local_108.values.super_array<unsigned_int,_16UL>.elems[0xe] =
       local_148.values.super_array<unsigned_int,_16UL>.elems[0xe];
  local_108.values.super_array<unsigned_int,_16UL>.elems[0xf] =
       local_148.values.super_array<unsigned_int,_16UL>.elems[0xf];
  local_108.values.super_array<unsigned_int,_16UL>.elems[8] =
       local_148.values.super_array<unsigned_int,_16UL>.elems[8];
  local_108.values.super_array<unsigned_int,_16UL>.elems[9] =
       local_148.values.super_array<unsigned_int,_16UL>.elems[9];
  local_108.values.super_array<unsigned_int,_16UL>.elems[10] =
       local_148.values.super_array<unsigned_int,_16UL>.elems[10];
  local_108.values.super_array<unsigned_int,_16UL>.elems[0xb] =
       local_148.values.super_array<unsigned_int,_16UL>.elems[0xb];
  local_108.values.super_array<unsigned_int,_16UL>.elems[4] =
       local_148.values.super_array<unsigned_int,_16UL>.elems[4];
  local_108.values.super_array<unsigned_int,_16UL>.elems[5] =
       local_148.values.super_array<unsigned_int,_16UL>.elems[5];
  local_108.values.super_array<unsigned_int,_16UL>.elems[6] =
       local_148.values.super_array<unsigned_int,_16UL>.elems[6];
  local_108.values.super_array<unsigned_int,_16UL>.elems[7] =
       local_148.values.super_array<unsigned_int,_16UL>.elems[7];
  local_108.values.super_array<unsigned_int,_16UL>.elems[0] =
       local_148.values.super_array<unsigned_int,_16UL>.elems[0];
  local_108.values.super_array<unsigned_int,_16UL>.elems[1] =
       local_148.values.super_array<unsigned_int,_16UL>.elems[1];
  local_108.values.super_array<unsigned_int,_16UL>.elems[2] =
       local_148.values.super_array<unsigned_int,_16UL>.elems[2];
  local_108.values.super_array<unsigned_int,_16UL>.elems[3] =
       local_148.values.super_array<unsigned_int,_16UL>.elems[3];
LAB_001b14bd:
  local_148.values.super_array<unsigned_int,_16UL>.elems[0xc] =
       local_108.values.super_array<unsigned_int,_16UL>.elems[0xc];
  local_148.values.super_array<unsigned_int,_16UL>.elems[0xd] =
       local_108.values.super_array<unsigned_int,_16UL>.elems[0xd];
  local_148.values.super_array<unsigned_int,_16UL>.elems[0xe] =
       local_108.values.super_array<unsigned_int,_16UL>.elems[0xe];
  local_148.values.super_array<unsigned_int,_16UL>.elems[0xf] =
       local_108.values.super_array<unsigned_int,_16UL>.elems[0xf];
  local_148.values.super_array<unsigned_int,_16UL>.elems[8] =
       local_108.values.super_array<unsigned_int,_16UL>.elems[8];
  local_148.values.super_array<unsigned_int,_16UL>.elems[9] =
       local_108.values.super_array<unsigned_int,_16UL>.elems[9];
  local_148.values.super_array<unsigned_int,_16UL>.elems[10] =
       local_108.values.super_array<unsigned_int,_16UL>.elems[10];
  local_148.values.super_array<unsigned_int,_16UL>.elems[0xb] =
       local_108.values.super_array<unsigned_int,_16UL>.elems[0xb];
  local_148.values.super_array<unsigned_int,_16UL>.elems[4] =
       local_108.values.super_array<unsigned_int,_16UL>.elems[4];
  local_148.values.super_array<unsigned_int,_16UL>.elems[5] =
       local_108.values.super_array<unsigned_int,_16UL>.elems[5];
  local_148.values.super_array<unsigned_int,_16UL>.elems[6] =
       local_108.values.super_array<unsigned_int,_16UL>.elems[6];
  local_148.values.super_array<unsigned_int,_16UL>.elems[7] =
       local_108.values.super_array<unsigned_int,_16UL>.elems[7];
  local_148.values.super_array<unsigned_int,_16UL>.elems[0] =
       local_108.values.super_array<unsigned_int,_16UL>.elems[0];
  local_148.values.super_array<unsigned_int,_16UL>.elems[1] =
       local_108.values.super_array<unsigned_int,_16UL>.elems[1];
  local_148.values.super_array<unsigned_int,_16UL>.elems[2] =
       local_108.values.super_array<unsigned_int,_16UL>.elems[2];
  local_148.values.super_array<unsigned_int,_16UL>.elems[3] =
       local_108.values.super_array<unsigned_int,_16UL>.elems[3];
  if (local_80 != 0) {
    if ((local_80 & 0xfffffe00) == 0) {
      uintwide_t<512U,_unsigned_int,_void,_false>::shl<unsigned_long>(&local_148,local_80);
    }
    else {
      local_148.values.super_array<unsigned_int,_16UL>.elems[0xc] = 0;
      local_148.values.super_array<unsigned_int,_16UL>.elems[0xd] = 0;
      local_148.values.super_array<unsigned_int,_16UL>.elems[0xe] = 0;
      local_148.values.super_array<unsigned_int,_16UL>.elems[0xf] = 0;
      local_148.values.super_array<unsigned_int,_16UL>.elems[8] = 0;
      local_148.values.super_array<unsigned_int,_16UL>.elems[9] = 0;
      local_148.values.super_array<unsigned_int,_16UL>.elems[10] = 0;
      local_148.values.super_array<unsigned_int,_16UL>.elems[0xb] = 0;
      local_148.values.super_array<unsigned_int,_16UL>.elems[4] = 0;
      local_148.values.super_array<unsigned_int,_16UL>.elems[5] = 0;
      local_148.values.super_array<unsigned_int,_16UL>.elems[6] = 0;
      local_148.values.super_array<unsigned_int,_16UL>.elems[7] = 0;
      local_148.values.super_array<unsigned_int,_16UL>.elems[0] = 0;
      local_148.values.super_array<unsigned_int,_16UL>.elems[1] = 0;
      local_148.values.super_array<unsigned_int,_16UL>.elems[2] = 0;
      local_148.values.super_array<unsigned_int,_16UL>.elems[3] = 0;
    }
  }
  goto LAB_001b152c;
}

Assistant:

constexpr auto gcd(const uintwide_t<Width2, LimbType, AllocatorType, IsSigned>& a, // NOLINT(readability-function-cognitive-complexity,bugprone-easily-swappable-parameters)
                     const uintwide_t<Width2, LimbType, AllocatorType, IsSigned>& b) -> uintwide_t<Width2, LimbType, AllocatorType, IsSigned>
  {
    // This implementation of GCD is an adaptation
    // of existing code from Boost.Multiprecision.

    using local_wide_integer_type = uintwide_t<Width2, LimbType, AllocatorType, IsSigned>;
    using local_ushort_type       = typename local_wide_integer_type::limb_type;
    using local_ularge_type       = typename local_wide_integer_type::double_limb_type;

    const auto u_is_neg = local_wide_integer_type::is_neg(a);
    const auto v_is_neg = local_wide_integer_type::is_neg(b);

    local_wide_integer_type u((!u_is_neg) ? a : -a);
    local_wide_integer_type v((!v_is_neg) ? b : -b);

    local_wide_integer_type result;

    using local_size_type = typename local_wide_integer_type::representation_type::size_type;

    if(u == v)
    { // NOLINT(bugprone-branch-clone)
      // This handles cases having (u = v) and also (u = v = 0).
      result = std::move(u); // LCOV_EXCL_LINE
    }
    else if((static_cast<local_ushort_type>(v) == static_cast<local_ushort_type>(UINT8_C(0))) && (v == static_cast<unsigned>(UINT8_C(0))))
    {
      // This handles cases having (v = 0) with (u != 0).
      result = std::move(u); // LCOV_EXCL_LINE
    }
    else if((static_cast<local_ushort_type>(u) == static_cast<local_ushort_type>(UINT8_C(0))) && (u == static_cast<unsigned>(UINT8_C(0))))
    {
      // This handles cases having (u = 0) with (v != 0).
      result = std::move(v); // LCOV_EXCL_LINE
    }
    else
    {
      // Now we handle cases having (u != 0) and (v != 0).

      // Let shift := lg K, where K is the greatest
      // power of 2 dividing both u and v.

      const unsigned_fast_type u_shift = lsb(u);
      const unsigned_fast_type v_shift = lsb(v);

      const unsigned_fast_type left_shift_amount = (detail::min_unsafe)(u_shift, v_shift);

      u >>= u_shift;
      v >>= v_shift;

      for(;;)
      {
        // Now u and v are both odd, so diff(u, v) is even.
        // Let u = min(u, v), v = diff(u, v) / 2.

        if(u > v)
        {
          swap(u, v);
        }

        if(u == v)
        {
          break;
        }

        if(v <= (std::numeric_limits<local_ularge_type>::max)())
        {
          const auto my_v_hi =
            static_cast<local_ushort_type>
            (
              (v.crepresentation().size() >= static_cast<typename local_wide_integer_type::representation_type::size_type>(UINT8_C(2)))
                ? static_cast<local_ushort_type>(*detail::advance_and_point(v.crepresentation().cbegin(), static_cast<local_size_type>(UINT8_C(1))))
                : static_cast<local_ushort_type>(UINT8_C(0))
            );

          const auto my_u_hi =
            static_cast<local_ushort_type>
            (
              (u.crepresentation().size() >= static_cast<typename local_wide_integer_type::representation_type::size_type>(UINT8_C(2)))
                ? static_cast<local_ushort_type>(*detail::advance_and_point(u.crepresentation().cbegin(), static_cast<local_size_type>(UINT8_C(1))))
                : static_cast<local_ushort_type>(UINT8_C(0))
            );

          const local_ularge_type v_large = detail::make_large(*v.crepresentation().cbegin(), my_v_hi);
          const local_ularge_type u_large = detail::make_large(*u.crepresentation().cbegin(), my_u_hi);

          u = detail::integer_gcd_reduce(v_large, u_large);

          break;
        }

        v  -= u;
        v >>= lsb(v);
      }

      result = (u << left_shift_amount);
    }
   
    if(u_is_neg != v_is_neg)
    {
      result.negate();
    }

    return result;
  }